

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  long in_RDI;
  string module_name_1;
  int i_1;
  string import_statement;
  int last_dot_pos;
  string module_alias;
  string module_name;
  string *filename;
  int i;
  string *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  string local_170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  Printer *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  Printer *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  Printer *in_stack_fffffffffffffee0;
  string local_108 [8];
  FileDescriptor *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  Generator *in_stack_ffffffffffffff10;
  string local_e8 [32];
  string local_c8 [16];
  string *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [32];
  int local_68;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar5 = local_c;
    iVar2 = FileDescriptor::dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
    if (iVar2 <= iVar5) break;
    pFVar4 = FileDescriptor::dependency
                       ((FileDescriptor *)CONCAT44(iVar5,in_stack_fffffffffffffe80),
                        (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    local_18 = FileDescriptor::name_abi_cxx11_(pFVar4);
    anon_unknown_0::ModuleName(in_stack_fffffffffffffea8);
    anon_unknown_0::ModuleAlias(in_stack_ffffffffffffff48);
    bVar1 = anon_unknown_0::ContainsPythonKeyword(in_stack_fffffffffffffea8);
    in_stack_fffffffffffffe80 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe80);
    if (bVar1) {
      io::Printer::Print<>(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      iVar2 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 &in_stack_fffffffffffffed0->variable_delimiter_,in_stack_fffffffffffffec8,
                 &in_stack_fffffffffffffec0->variable_delimiter_,in_stack_fffffffffffffeb8);
    }
    else {
      local_68 = std::__cxx11::string::rfind((char)local_38,0x2e);
      std::__cxx11::string::string(local_88);
      if (local_68 == -1) {
        std::operator+((char *)in_stack_fffffffffffffeb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        iVar2 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        std::__cxx11::string::operator=(local_88,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
      else {
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffed8,(ulong)local_38);
        std::operator+((char *)in_stack_fffffffffffffe78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        std::operator+(in_stack_fffffffffffffe78,
                       (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        iVar2 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffeb8,(ulong)local_38);
        std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=(local_88,local_c8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
      }
      io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 &in_stack_fffffffffffffed0->variable_delimiter_,in_stack_fffffffffffffec8,
                 &in_stack_fffffffffffffec0->variable_delimiter_,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_88);
    }
    in_stack_fffffffffffffe78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         FileDescriptor::dependency
                   ((FileDescriptor *)CONCAT44(iVar5,in_stack_fffffffffffffe80),iVar2);
    CopyPublicDependenciesAliases
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
    local_c = local_c + 1;
  }
  io::Printer::Print<>(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  iVar5 = 0;
  while( true ) {
    iVar2 = iVar5;
    iVar3 = FileDescriptor::public_dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
    if (iVar3 <= iVar5) break;
    pFVar4 = FileDescriptor::public_dependency
                       ((FileDescriptor *)CONCAT44(iVar5,in_stack_fffffffffffffe70),
                        (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    FileDescriptor::name_abi_cxx11_(pFVar4);
    in_stack_fffffffffffffe68 = local_170;
    anon_unknown_0::ModuleName(in_stack_fffffffffffffea8);
    io::Printer::Print<char[7],std::__cxx11::string>
              (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
               &in_stack_fffffffffffffec0->variable_delimiter_,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_170);
    iVar5 = iVar2 + 1;
  }
  io::Printer::Print<>(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const std::string& filename = file_->dependency(i)->name();

    std::string module_name = ModuleName(filename);
    std::string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      std::string import_statement;
      if (last_dot_pos == std::string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    std::string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}